

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnFunction(BinaryReaderIR *this,Index index,Index sig_index)

{
  char *pcVar1;
  Offset OVar2;
  FuncType *pFVar3;
  tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_> tVar4;
  size_t sVar5;
  undefined1 auStack_a8 [8];
  Location loc_1;
  Location loc;
  tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_> local_40;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> field;
  
  loc_1.field_1._8_8_ = 0;
  pcVar1 = this->filename_;
  strlen(pcVar1);
  loc_1.field_1._8_8_ = pcVar1;
  MakeUnique<wabt::FuncModuleField,wabt::Location>
            ((wabt *)&local_40,(Location *)((long)&loc_1.field_1 + 8));
  tVar4.super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       (_Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       local_40;
  (((Func *)((long)local_40.
                   super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                   .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x40))->
  decl).has_func_type = true;
  loc_1.filename.size_._0_4_ = 0;
  loc_1.filename.size_._4_4_ = 0;
  loc_1.field_1.field_0.line = 0;
  auStack_a8 = (undefined1  [8])0x0;
  loc_1.filename.data_._0_4_ = 0;
  loc_1.filename.data_._4_4_ = 0;
  pcVar1 = this->filename_;
  sVar5 = strlen(pcVar1);
  loc_1.filename.data_._0_4_ = (undefined4)sVar5;
  loc_1.filename.data_._4_4_ = (undefined4)(sVar5 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.filename.size_._0_4_ = (undefined4)OVar2;
  loc_1.filename.size_._4_4_ = (undefined4)(OVar2 >> 0x20);
  auStack_a8 = (undefined1  [8])pcVar1;
  Var::Var((Var *)((long)&loc_1.field_1 + 8),sig_index,(Location *)auStack_a8);
  Var::operator=(&(((Func *)((long)tVar4.
                                   super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                                   .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>.
                                   _M_head_impl + 0x40))->decl).type_var,
                 (Var *)((long)&loc_1.field_1 + 8));
  Var::~Var((Var *)((long)&loc_1.field_1 + 8));
  pFVar3 = (this->module_->func_types).
           super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
           super__Vector_impl_data._M_start[sig_index];
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            (&(((Func *)((long)tVar4.
                               super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                               .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl +
                        0x40))->decl).sig.param_types,&(pFVar3->sig).param_types);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            (&(((Func *)((long)tVar4.
                               super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                               .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl +
                        0x40))->decl).sig.result_types,&(pFVar3->sig).result_types);
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
  super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>,_true,_true>
          )local_40.
           super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
           .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl;
  local_40.
  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
  super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       (_Head_base<0UL,_wabt::FuncModuleField_*,_false>)0x0;
  Module::AppendField(this->module_,&field);
  if ((__uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>)
      field._M_t.
      super___uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>._M_t
      .super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
      super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>)0x0) {
    (**(code **)(*(long *)field._M_t.
                          super___uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
  super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>,_true,_true>
        )(__uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>)0x0;
  if (local_40.
      super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
      super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::FuncModuleField_*,_false>)0x0) {
    (**(code **)(*(long *)local_40.
                          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFunction(Index index, Index sig_index) {
  auto field = MakeUnique<FuncModuleField>(GetLocation());
  Func& func = field->func;
  func.decl.has_func_type = true;
  func.decl.type_var = Var(sig_index, GetLocation());
  func.decl.sig = module_->func_types[sig_index]->sig;
  module_->AppendField(std::move(field));
  return Result::Ok;
}